

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5DecodeFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  u16 uVar1;
  int nBlob;
  int iVar2;
  void *pvVar3;
  void *__src;
  int local_114;
  int local_110;
  u32 local_10c;
  int iEnd;
  int nByte;
  int bFirst;
  int nDoclist;
  int iOff_1;
  int iRowidOff;
  int iTermOff_1;
  int iPgidxPrev;
  int iPgidxOff_1;
  int szLeaf_1;
  Fts5Buffer term_1;
  u32 local_d0;
  int nIncr;
  int nAppend;
  int iOff;
  int nKeep;
  int iTermOff;
  int iPgidxOff;
  int szLeaf;
  Fts5Buffer term;
  Fts5DlidxLvl lvl;
  Fts5Data dlidx;
  int eDetailNone;
  sqlite3_int64 nSpace;
  undefined1 auStack_60 [4];
  int rc;
  Fts5Buffer s;
  u8 *a;
  int n;
  u8 *aBlob;
  int bDlidx;
  int iPgno;
  int iHeight;
  int iSegid;
  i64 iRowid;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  s.n = 0;
  s.nSpace = 0;
  nSpace._4_4_ = 0;
  iRowid = (i64)apVal;
  apVal_local._4_4_ = nArg;
  psStack_10 = pCtx;
  pvVar3 = sqlite3_user_data(pCtx);
  memset(auStack_60,0,0x10);
  _iHeight = sqlite3_value_int64(*(sqlite3_value **)iRowid);
  nBlob = sqlite3_value_bytes(*(sqlite3_value **)(iRowid + 8));
  __src = sqlite3_value_blob(*(sqlite3_value **)(iRowid + 8));
  s._8_8_ = sqlite3Fts5MallocZero((int *)((long)&nSpace + 4),(long)(nBlob + 8));
  if ((void *)s._8_8_ != (void *)0x0) {
    if (0 < nBlob) {
      memcpy((void *)s._8_8_,__src,(long)nBlob);
    }
    fts5DecodeRowid(_iHeight,&iPgno,(int *)&aBlob,&bDlidx,(int *)((long)&aBlob + 4));
    fts5DebugRowid((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,_iHeight);
    if ((int)aBlob == 0) {
      if (iPgno == 0) {
        if (_iHeight == 1) {
          fts5DecodeAverages((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,(u8 *)s._8_8_,nBlob
                            );
        }
        else {
          fts5DecodeStructure((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,(u8 *)s._8_8_,
                              nBlob);
        }
      }
      else if (pvVar3 == (void *)0x0) {
        iRowidOff = 0;
        iOff_1 = 0;
        nDoclist = 0;
        memset(&iPgidxOff_1,0,0x10);
        if (nBlob < 4) {
          sqlite3Fts5BufferSet((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,7,"corrupt");
        }
        else {
          uVar1 = fts5GetU16((u8 *)s._8_8_);
          nDoclist = (int)uVar1;
          uVar1 = fts5GetU16((u8 *)(s._8_8_ + 2));
          iTermOff_1 = (int)uVar1;
          iPgidxPrev = iTermOff_1;
          if (iTermOff_1 < nBlob) {
            sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)iTermOff_1),(u32 *)&iOff_1);
          }
          else if (nBlob < iTermOff_1) {
            nSpace._4_4_ = 0x10b;
            goto LAB_0020a07d;
          }
          if (nDoclist == 0) {
            if (iOff_1 == 0) {
              bFirst = iPgidxPrev;
            }
            else {
              bFirst = iOff_1;
            }
          }
          else {
            bFirst = nDoclist;
          }
          if (nBlob < bFirst) {
            nSpace._4_4_ = 0x10b;
          }
          else {
            fts5DecodePoslist((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,
                              (u8 *)(s._8_8_ + 4),bFirst + -4);
            if (iOff_1 == 0) {
              local_114 = iPgidxPrev;
            }
            else {
              local_114 = iOff_1;
            }
            nByte = local_114 - bFirst;
            if (nBlob < nByte + bFirst) {
              nSpace._4_4_ = 0x10b;
            }
            else {
              fts5DecodeDoclist((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,
                                (u8 *)(s._8_8_ + (long)bFirst),nByte);
              while (iTermOff_1 < nBlob && nSpace._4_4_ == 0) {
                iEnd = (int)(iTermOff_1 == iPgidxPrev);
                iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)iTermOff_1),&local_10c);
                iTermOff_1 = iVar2 + iTermOff_1;
                bFirst = local_10c + iRowidOff;
                iRowidOff = bFirst;
                if (iTermOff_1 < nBlob) {
                  sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)iTermOff_1),&local_10c);
                  local_110 = iRowidOff + local_10c;
                }
                else {
                  local_110 = iPgidxPrev;
                }
                if (iPgidxPrev < local_110) {
                  nSpace._4_4_ = 0x10b;
                  break;
                }
                if (iEnd == 0) {
                  iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)bFirst),&local_10c);
                  bFirst = iVar2 + bFirst;
                  if ((int)(u32)term_1.p < (int)local_10c) {
                    nSpace._4_4_ = 0x10b;
                    break;
                  }
                  term_1.p._0_4_ = local_10c;
                }
                iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)bFirst),&local_10c);
                bFirst = iVar2 + bFirst;
                if (nBlob < (int)(bFirst + local_10c)) {
                  nSpace._4_4_ = 0x10b;
                  break;
                }
                sqlite3Fts5BufferAppendBlob
                          ((int *)((long)&nSpace + 4),(Fts5Buffer *)&iPgidxOff_1,local_10c,
                           (u8 *)(s._8_8_ + (long)bFirst));
                bFirst = local_10c + bFirst;
                sqlite3Fts5BufferAppendPrintf
                          ((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60," term=%.*s",
                           (ulong)(u32)term_1.p,_iPgidxOff_1);
                iVar2 = fts5DecodeDoclist((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,
                                          (u8 *)(s._8_8_ + (long)bFirst),local_110 - bFirst);
                bFirst = iVar2 + bFirst;
              }
              sqlite3Fts5BufferFree((Fts5Buffer *)&iPgidxOff_1);
            }
          }
        }
      }
      else {
        uVar1 = fts5GetU16((u8 *)(s._8_8_ + 2));
        nKeep = (int)uVar1;
        nAppend = 0;
        iTermOff = nKeep;
        memset(&iPgidxOff,0,0x10);
        if (iTermOff < nBlob) {
          iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)nKeep),(u32 *)&iOff);
          nKeep = iVar2 + nKeep;
        }
        else {
          iOff = iTermOff;
        }
        fts5DecodeRowidList((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,(u8 *)(s._8_8_ + 4),
                            iOff + -4);
        nIncr = iOff;
        while (nIncr < iTermOff) {
          iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)nIncr),&local_d0);
          nIncr = iVar2 + nIncr;
          term.p._0_4_ = nAppend;
          sqlite3Fts5BufferAppendBlob
                    ((int *)((long)&nSpace + 4),(Fts5Buffer *)&iPgidxOff,local_d0,
                     (u8 *)(s._8_8_ + (long)nIncr));
          sqlite3Fts5BufferAppendPrintf
                    ((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60," term=%.*s",
                     (ulong)(uint)term.p,_iPgidxOff);
          nIncr = local_d0 + nIncr;
          if (nKeep < nBlob) {
            iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)nKeep),(u32 *)&term_1.nSpace);
            nKeep = iVar2 + nKeep;
            iOff = term_1.nSpace + iOff;
          }
          else {
            iOff = iTermOff;
          }
          fts5DecodeRowidList((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60,
                              (u8 *)(s._8_8_ + (long)nIncr),iOff - nIncr);
          nIncr = iOff;
          if (iOff < iTermOff) {
            iVar2 = sqlite3Fts5GetVarint32((uchar *)(s._8_8_ + (long)iOff),(u32 *)&nAppend);
            nIncr = iVar2 + nIncr;
          }
        }
        sqlite3Fts5BufferFree((Fts5Buffer *)&iPgidxOff);
      }
    }
    else {
      lvl.iRowid._0_4_ = s.n;
      lvl.iRowid._4_4_ = s.nSpace;
      memset(&term.n,0,0x20);
      term._8_8_ = &lvl.iRowid;
      lvl.bEof = aBlob._4_4_;
      fts5DlidxLvlNext((Fts5DlidxLvl *)&term.n);
      while (lvl.pData._4_4_ == 0) {
        sqlite3Fts5BufferAppendPrintf
                  ((int *)((long)&nSpace + 4),(Fts5Buffer *)auStack_60," %d(%lld)",
                   (ulong)(uint)lvl.bEof,lvl._16_8_);
        fts5DlidxLvlNext((Fts5DlidxLvl *)&term.n);
      }
    }
  }
LAB_0020a07d:
  sqlite3_free((void *)s._8_8_);
  if (nSpace._4_4_ == 0) {
    sqlite3_result_text(psStack_10,(char *)_auStack_60,(int)s.p,
                        (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(psStack_10,nSpace._4_4_);
  }
  sqlite3Fts5BufferFree((Fts5Buffer *)auStack_60);
  return;
}

Assistant:

static void fts5DecodeFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  i64 iRowid;                     /* Rowid for record being decoded */
  int iSegid,iHeight,iPgno,bDlidx;/* Rowid components */
  const u8 *aBlob; int n;         /* Record to decode */
  u8 *a = 0;
  Fts5Buffer s;                   /* Build up text to return here */
  int rc = SQLITE_OK;             /* Return code */
  sqlite3_int64 nSpace = 0;
  int eDetailNone = (sqlite3_user_data(pCtx)!=0);

  assert( nArg==2 );
  UNUSED_PARAM(nArg);
  memset(&s, 0, sizeof(Fts5Buffer));
  iRowid = sqlite3_value_int64(apVal[0]);

  /* Make a copy of the second argument (a blob) in aBlob[]. The aBlob[]
  ** copy is followed by FTS5_DATA_ZERO_PADDING 0x00 bytes, which prevents
  ** buffer overreads even if the record is corrupt.  */
  n = sqlite3_value_bytes(apVal[1]);
  aBlob = sqlite3_value_blob(apVal[1]);
  nSpace = n + FTS5_DATA_ZERO_PADDING;
  a = (u8*)sqlite3Fts5MallocZero(&rc, nSpace);
  if( a==0 ) goto decode_out;
  if( n>0 ) memcpy(a, aBlob, n);

  fts5DecodeRowid(iRowid, &iSegid, &bDlidx, &iHeight, &iPgno);

  fts5DebugRowid(&rc, &s, iRowid);
  if( bDlidx ){
    Fts5Data dlidx;
    Fts5DlidxLvl lvl;

    dlidx.p = a;
    dlidx.nn = n;

    memset(&lvl, 0, sizeof(Fts5DlidxLvl));
    lvl.pData = &dlidx;
    lvl.iLeafPgno = iPgno;

    for(fts5DlidxLvlNext(&lvl); lvl.bEof==0; fts5DlidxLvlNext(&lvl)){
      sqlite3Fts5BufferAppendPrintf(&rc, &s, 
          " %d(%lld)", lvl.iLeafPgno, lvl.iRowid
      );
    }
  }else if( iSegid==0 ){
    if( iRowid==FTS5_AVERAGES_ROWID ){
      fts5DecodeAverages(&rc, &s, a, n);
    }else{
      fts5DecodeStructure(&rc, &s, a, n);
    }
  }else if( eDetailNone ){
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;
    int iPgidxOff = szLeaf = fts5GetU16(&a[2]);
    int iTermOff;
    int nKeep = 0;
    int iOff;

    memset(&term, 0, sizeof(Fts5Buffer));

    /* Decode any entries that occur before the first term. */
    if( szLeaf<n ){
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], iTermOff);
    }else{
      iTermOff = szLeaf;
    }
    fts5DecodeRowidList(&rc, &s, &a[4], iTermOff-4);

    iOff = iTermOff;
    while( iOff<szLeaf ){
      int nAppend;

      /* Read the term data for the next term*/
      iOff += fts5GetVarint32(&a[iOff], nAppend);
      term.n = nKeep;
      fts5BufferAppendBlob(&rc, &term, nAppend, &a[iOff]);
      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += nAppend;

      /* Figure out where the doclist for this term ends */
      if( iPgidxOff<n ){
        int nIncr;
        iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nIncr);
        iTermOff += nIncr;
      }else{
        iTermOff = szLeaf;
      }

      fts5DecodeRowidList(&rc, &s, &a[iOff], iTermOff-iOff);
      iOff = iTermOff;
      if( iOff<szLeaf ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }

    fts5BufferFree(&term);
  }else{
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;                   /* Offset of pgidx in a[] */
    int iPgidxOff;
    int iPgidxPrev = 0;           /* Previous value read from pgidx */
    int iTermOff = 0;
    int iRowidOff = 0;
    int iOff;
    int nDoclist;

    memset(&term, 0, sizeof(Fts5Buffer));

    if( n<4 ){
      sqlite3Fts5BufferSet(&rc, &s, 7, (const u8*)"corrupt");
      goto decode_out;
    }else{
      iRowidOff = fts5GetU16(&a[0]);
      iPgidxOff = szLeaf = fts5GetU16(&a[2]);
      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], iTermOff);
      }else if( iPgidxOff>n ){
        rc = FTS5_CORRUPT;
        goto decode_out;
      }
    }

    /* Decode the position list tail at the start of the page */
    if( iRowidOff!=0 ){
      iOff = iRowidOff;
    }else if( iTermOff!=0 ){
      iOff = iTermOff;
    }else{
      iOff = szLeaf;
    }
    if( iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodePoslist(&rc, &s, &a[4], iOff-4);

    /* Decode any more doclist data that appears on the page before the
    ** first term. */
    nDoclist = (iTermOff ? iTermOff : szLeaf) - iOff;
    if( nDoclist+iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodeDoclist(&rc, &s, &a[iOff], nDoclist);

    while( iPgidxOff<n && rc==SQLITE_OK ){
      int bFirst = (iPgidxOff==szLeaf);     /* True for first term on page */
      int nByte;                            /* Bytes of data */
      int iEnd;
      
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nByte);
      iPgidxPrev += nByte;
      iOff = iPgidxPrev;

      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], nByte);
        iEnd = iPgidxPrev + nByte;
      }else{
        iEnd = szLeaf;
      }
      if( iEnd>szLeaf ){
        rc = FTS5_CORRUPT;
        break;
      }

      if( bFirst==0 ){
        iOff += fts5GetVarint32(&a[iOff], nByte);
        if( nByte>term.n ){
          rc = FTS5_CORRUPT;
          break;
        }
        term.n = nByte;
      }
      iOff += fts5GetVarint32(&a[iOff], nByte);
      if( iOff+nByte>n ){
        rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferAppendBlob(&rc, &term, nByte, &a[iOff]);
      iOff += nByte;

      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += fts5DecodeDoclist(&rc, &s, &a[iOff], iEnd-iOff);
    }

    fts5BufferFree(&term);
  }
  
 decode_out:
  sqlite3_free(a);
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)s.p, s.n, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  fts5BufferFree(&s);
}